

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matdurbn.c
# Opt level: O2

MATRIX mat_durbin(MATRIX R)

{
  int iVar1;
  double *pdVar2;
  MATRIX A;
  MATRIX A_00;
  MATRIX A_01;
  MATRIX A_02;
  double *pdVar3;
  MATRIX ppdVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint row;
  int row_00;
  double dVar9;
  double dVar10;
  
  iVar1 = *(int *)(R + -1);
  row = iVar1 - 1;
  row_00 = iVar1 + 1;
  A = mat_creat(row_00,1,-1);
  A_00 = mat_creat(row_00,1,-1);
  A_01 = mat_creat(row_00,1,-1);
  A_02 = mat_creat(row_00,row_00,-1);
  **A = *R[1];
  pdVar3 = *A_00;
  *pdVar3 = **R;
  lVar7 = 0;
  for (uVar5 = 1; (long)uVar5 < (long)iVar1; uVar5 = uVar5 + 1) {
    dVar9 = *A[uVar5 - 1] / *pdVar3;
    pdVar2 = A_01[uVar5];
    *pdVar2 = dVar9;
    dVar10 = *pdVar3;
    pdVar3 = A_00[uVar5];
    *pdVar3 = (1.0 - dVar9 * dVar9) * dVar10;
    A_02[uVar5][uVar5] = -*pdVar2;
    ppdVar4 = A_02 + 1;
    lVar8 = lVar7;
    if (1 < uVar5) {
      while (lVar8 != 0) {
        (*ppdVar4)[uVar5] = (*ppdVar4)[uVar5 - 1] - *pdVar2 * A_02[lVar8][uVar5 - 1];
        ppdVar4 = ppdVar4 + 1;
        lVar8 = lVar8 + -1;
      }
    }
    if (uVar5 != row) {
      dVar10 = *R[uVar5 + 1];
      pdVar2 = A[uVar5];
      *pdVar2 = dVar10;
      ppdVar4 = A_02 + 1;
      uVar6 = uVar5;
      while (uVar6 != 0) {
        dVar10 = dVar10 + (*ppdVar4)[uVar5] * *R[uVar6];
        *pdVar2 = dVar10;
        ppdVar4 = ppdVar4 + 1;
        uVar6 = uVar6 - 1;
      }
    }
    lVar7 = lVar7 + 1;
  }
  ppdVar4 = mat_creat(row,1,-1);
  uVar6 = 0;
  uVar5 = 0;
  if (0 < (int)row) {
    uVar5 = (ulong)row;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    *ppdVar4[uVar6] = -A_02[uVar6 + 1][(int)row];
  }
  mat_free(A_02);
  mat_free(A);
  mat_free(A_01);
  mat_free(A_00);
  return ppdVar4;
}

Assistant:

MATRIX mat_durbin( MATRIX R )
{
	int	i, i1, j, ji, p;
	MATRIX	W, E, K, A, X;

	p = MatRow(R) - 1;
	W = mat_creat( p+2, 1, UNDEFINED );
	E = mat_creat( p+2, 1, UNDEFINED );
	K = mat_creat( p+2, 1, UNDEFINED );
	A = mat_creat( p+2, p+2, UNDEFINED );

	W[0][0] = R[1][0];
	E[0][0] = R[0][0];

	for (i=1; i<=p; i++)
		{
		K[i][0] = W[i-1][0] / E[i-1][0];
		E[i][0] = E[i-1][0] * (1.0 - K[i][0] * K[i][0]);

		A[i][i] = -K[i][0];

		i1 = i-1;
		if (i1 >= 1)
			{
			for (j=1; j<=i1; j++)
				{
				ji = i - j;
				A[j][i] = A[j][i1] - K[i][0] * A[ji][i1];
				}
			}

		if (i != p)
			{
			W[i][0] = R[i+1][0];
			for (j=1; j<=i; j++)
				W[i][0] += A[j][i] * R[i-j+1][0];
			}
		}

	X = mat_creat( p, 1, UNDEFINED );
	for (i=0; i<p; i++)
		{
		X[i][0] = -A[i+1][p];
		}

	mat_free( A );
	mat_free( W );
	mat_free( K );
	mat_free( E );
	return (X);
}